

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O2

void __thiscall Enterprise::Nick::Nick(Nick *this,uint8_t *ram)

{
  uint16_t *puVar1;
  Rect visible_area;
  
  Outputs::CRT::CRT::CRT(&this->crt_,0x390,0x10,PAL50,Red4Green4Blue4);
  this->ram_ = ram;
  this->line_parameter_control_ = 0xc0;
  this->line_parameter_base_ = 0;
  this->border_colour_ = 0;
  this->horizontal_counter_ = 0;
  this->line_parameter_pointer_ = 0;
  this->should_reload_line_parameters_ = true;
  this->last_read_ = 0xff;
  this->lines_remaining_ = '\0';
  this->two_colour_mask_ = 0xff;
  this->left_margin_ = 0;
  this->right_margin_ = 0;
  puVar1 = this->palette_;
  this->alt_ind_palettes[0] = puVar1;
  this->alt_ind_palettes[1] = puVar1;
  this->alt_ind_palettes[2] = puVar1;
  this->alt_ind_palettes[3] = puVar1;
  this->mode_ = Vsync;
  this->is_sync_or_pixels_ = false;
  this->bpp_ = 0;
  this->column_size_ = 0;
  this->interrupt_line_ = true;
  this->vres_ = false;
  this->reload_line_parameter_pointer_ = false;
  this->line_data_per_column_increments_[0] = 0;
  this->line_data_per_column_increments_[1] = 0;
  this->palette_[4] = 0;
  this->palette_[5] = 0;
  this->palette_[6] = 0;
  this->palette_[7] = 0;
  this->palette_[8] = 0;
  this->palette_[9] = 0;
  this->palette_[10] = 0;
  this->palette_[0xb] = 0;
  this->output_duration_ = 0;
  this->output_type_ = Sync;
  this->palette_[0] = 0;
  this->palette_[1] = 0;
  this->palette_[2] = 0;
  this->palette_[3] = 0;
  this->pixel_pointer_ = (uint16_t *)0x0;
  this->allocated_pointer_ = (uint16_t *)0x0;
  this->palette_[0xc] = 0;
  this->palette_[0xd] = 0;
  this->palette_[0xe] = 0;
  this->palette_[0xf] = 0;
  this->first_pixel_window_ = 10;
  set_display_type(this,RGB);
  visible_area.size = (anon_struct_8_2_6a0cb59c_for_size)0x3f6666663f666666;
  visible_area.origin.x = 0.05;
  visible_area.origin.y = 0.05;
  Outputs::CRT::CRT::set_visible_area(&this->crt_,visible_area);
  return;
}

Assistant:

Nick::Nick(const uint8_t *ram) :
	crt_(57*16, 16, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red4Green4Blue4),
	ram_(ram) {

	// Just use RGB for now.
	set_display_type(Outputs::Display::DisplayType::RGB);

	// Crop to the centre 90% of the display.
	crt_.set_visible_area(Outputs::Display::Rect(0.05f, 0.05f, 0.9f, 0.9f));
}